

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_prot.c
# Opt level: O3

_Bool xdr_nrejected_reply(XDR *xdrs,rejected_reply *rr)

{
  uint *puVar1;
  uint uVar2;
  _Bool _Var3;
  reject_stat rVar4;
  xdr_op xVar5;
  uint8_t *future;
  uint8_t *future_1;
  anon_union_8_2_26426f7e_for_ru *paVar6;
  
  if (xdrs == (XDR *)0x0) {
    __assert_fail("xdrs != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_prot.c"
                  ,0x6f,"_Bool xdr_nrejected_reply(XDR *, struct rejected_reply *)");
  }
  if (rr == (rejected_reply *)0x0) {
    __assert_fail("rr != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_prot.c"
                  ,0x70,"_Bool xdr_nrejected_reply(XDR *, struct rejected_reply *)");
  }
  xVar5 = xdrs->x_op;
  if (xVar5 == XDR_FREE) {
LAB_00110e70:
    rVar4 = rr->rj_stat;
  }
  else {
    if (xVar5 != XDR_DECODE) {
      if (xVar5 != XDR_ENCODE) {
        return false;
      }
      rVar4 = rr->rj_stat;
      puVar1 = (uint *)((long)xdrs->x_data + 4);
      if ((xdrs->x_v).vio_wrap < puVar1) {
        _Var3 = (*xdrs->x_ops->x_putunit)(xdrs,rVar4);
        goto LAB_00110e52;
      }
      *(reject_stat *)xdrs->x_data =
           rVar4 >> 0x18 | (rVar4 & 0xff0000) >> 8 | (rVar4 & 0xff00) << 8 | rVar4 << 0x18;
      xdrs->x_data = (uint8_t *)puVar1;
      goto LAB_00110e70;
    }
    puVar1 = (uint *)((long)xdrs->x_data + 4);
    if ((xdrs->x_v).vio_tail < puVar1) {
      _Var3 = (*xdrs->x_ops->x_getunit)(xdrs,&rr->rj_stat);
LAB_00110e52:
      if (_Var3 == false) {
        return false;
      }
      goto LAB_00110e70;
    }
    uVar2 = *(uint *)xdrs->x_data;
    rVar4 = uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    rr->rj_stat = rVar4;
    xdrs->x_data = (uint8_t *)puVar1;
  }
  if (rVar4 == AUTH_ERROR) {
    xVar5 = xdrs->x_op;
    if (xVar5 == XDR_FREE) {
      return true;
    }
    paVar6 = &rr->ru;
    goto LAB_00110f0d;
  }
  if (rVar4 != RPC_MISMATCH) {
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_c_cmakelists/linuxbox2[P]ntirpc/src/rpc_prot.c"
                  ,0x80,"_Bool xdr_nrejected_reply(XDR *, struct rejected_reply *)");
  }
  paVar6 = &rr->ru;
  xVar5 = xdrs->x_op;
  if (xVar5 == XDR_ENCODE) {
    uVar2 = (paVar6->RJ_versions).low;
    puVar1 = (uint *)((long)xdrs->x_data + 4);
    if ((xdrs->x_v).vio_wrap < puVar1) {
      _Var3 = (*xdrs->x_ops->x_putunit)(xdrs,uVar2);
      goto LAB_00110ee5;
    }
    *(uint *)xdrs->x_data =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    xdrs->x_data = (uint8_t *)puVar1;
  }
  else {
    if (xVar5 != XDR_DECODE) {
      if (xVar5 != XDR_FREE) {
        return false;
      }
      return true;
    }
    puVar1 = (uint *)((long)xdrs->x_data + 4);
    if ((xdrs->x_v).vio_tail < puVar1) {
      _Var3 = (*xdrs->x_ops->x_getunit)(xdrs,&paVar6->RJ_why);
LAB_00110ee5:
      if (_Var3 == false) {
        return false;
      }
    }
    else {
      uVar2 = *(uint *)xdrs->x_data;
      (paVar6->RJ_versions).low =
           uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
      xdrs->x_data = (uint8_t *)puVar1;
    }
  }
  xVar5 = xdrs->x_op;
  if (xVar5 == XDR_FREE) {
    return true;
  }
  paVar6 = (anon_union_8_2_26426f7e_for_ru *)&(rr->ru).RJ_versions.high;
LAB_00110f0d:
  if (xVar5 == XDR_DECODE) {
    puVar1 = (uint *)((long)xdrs->x_data + 4);
    if ((xdrs->x_v).vio_tail < puVar1) {
      _Var3 = (*xdrs->x_ops->x_getunit)(xdrs,&paVar6->RJ_why);
      return _Var3;
    }
    uVar2 = *(uint *)xdrs->x_data;
    (paVar6->RJ_versions).low =
         uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
    xdrs->x_data = (uint8_t *)puVar1;
    return true;
  }
  if (xVar5 != XDR_ENCODE) {
    return false;
  }
  uVar2 = (paVar6->RJ_versions).low;
  puVar1 = (uint *)((long)xdrs->x_data + 4);
  if ((xdrs->x_v).vio_wrap < puVar1) {
    _Var3 = (*xdrs->x_ops->x_putunit)(xdrs,uVar2);
    return _Var3;
  }
  *(uint *)xdrs->x_data =
       uVar2 >> 0x18 | (uVar2 & 0xff0000) >> 8 | (uVar2 & 0xff00) << 8 | uVar2 << 0x18;
  xdrs->x_data = (uint8_t *)puVar1;
  return true;
}

Assistant:

bool
xdr_nrejected_reply(XDR *xdrs, struct rejected_reply *rr)
{
	assert(xdrs != NULL);
	assert(rr != NULL);

	/* personalized union, rather than calling xdr_union */
	if (!inline_xdr_enum(xdrs, (enum_t *) &(rr->rj_stat)))
		return (false);
	switch (rr->rj_stat) {

	case RPC_MISMATCH:
		if (!inline_xdr_u_int32_t(xdrs, &(rr->rj_vers.low)))
			return (false);
		return (inline_xdr_u_int32_t(xdrs, &(rr->rj_vers.high)));

	case AUTH_ERROR:
		return (inline_xdr_enum(xdrs, (enum_t *) &(rr->rj_why)));
	}
	/* NOTREACHED */
	assert(0);
	return (false);
}